

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O1

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Uint(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
       *this,uint u)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *buffer;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  
  PrettyPrefix(this,kNumberType);
  this_00 = &((this->
              super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              ).os_)->stack_;
  if ((long)this_00->stackEnd_ - (long)this_00->stackTop_ < 10) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,10);
  }
  buffer = this_00->stackTop_;
  this_00->stackTop_ = buffer + 10;
  pcVar2 = internal::u32toa(u,buffer);
  pGVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).os_;
  (pGVar1->stack_).stackTop_ = pcVar2 + (long)((pGVar1->stack_).stackTop_ + (-10 - (long)buffer));
  return true;
}

Assistant:

bool Uint(unsigned u)       { PrettyPrefix(kNumberType); return Base::EndValue(Base::WriteUint(u)); }